

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void write_lore_entries(ang_file *fff)

{
  undefined8 *puVar1;
  monster_race *pmVar2;
  monster_lore *pmVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  monster_friends_base *in_stack_fffffffffffffe78;
  undefined4 uVar7;
  char local_158 [8];
  char name_1 [120];
  object_kind *kind_1;
  monster_mimic *m;
  char *role_name_1;
  monster_friends_base *b;
  char *role_name;
  monster_friends *f;
  object_kind *kind;
  char name [120];
  monster_drop *drop;
  monster_lore_conflict *lore;
  monster_race *race;
  wchar_t n;
  wchar_t i;
  ang_file *fff_local;
  
  for (race._4_4_ = 0; pmVar3 = l_list, pmVar2 = r_info,
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20),
      race._4_4_ < (int)(z_info->r_max - 1); race._4_4_ = race._4_4_ + 1) {
    if ((r_info[race._4_4_].name != (char *)0x0) &&
       ((l_list[race._4_4_].sights != 0 || ((l_list[race._4_4_].all_known & 1U) != 0)))) {
      file_putf(fff,"name:%s\n",r_info[race._4_4_].name);
      if ((pmVar3[race._4_4_].all_known & 1U) != 0) {
        file_putf(fff,"base:%s\n",(pmVar2[race._4_4_].base)->name);
      }
      in_stack_fffffffffffffe78 =
           (monster_friends_base *)CONCAT44(uVar7,(uint)pmVar3[race._4_4_].ignore);
      uVar6 = (uint)pmVar3[race._4_4_].cast_innate;
      uVar4 = (uint)pmVar3[race._4_4_].cast_spell;
      file_putf(fff,"counts:%d:%d:%d:%d:%d:%d:%d\n",(ulong)pmVar3[race._4_4_].sights,
                (ulong)pmVar3[race._4_4_].deaths,(ulong)pmVar3[race._4_4_].tkills,
                (ulong)pmVar3[race._4_4_].wake,in_stack_fffffffffffffe78,uVar6,uVar4);
      for (race._0_4_ = 0; (int)(uint)race < (int)(uint)z_info->mon_blows_max;
          race._0_4_ = (uint)race + 1) {
        if ((((pmVar3[race._4_4_].blow_known[(int)(uint)race] & 1U) != 0) ||
            ((pmVar3[race._4_4_].all_known & 1U) != 0)) &&
           (pmVar3[race._4_4_].blows[(int)(uint)race].method != (blow_method_conflict *)0x0)) {
          file_putf(fff,"blow:%s",(pmVar3[race._4_4_].blows[(int)(uint)race].method)->name);
          file_putf(fff,":%s",(pmVar3[race._4_4_].blows[(int)(uint)race].effect)->name);
          file_putf(fff,":%d+%dd%dM%d",
                    (ulong)(uint)pmVar3[race._4_4_].blows[(int)(uint)race].dice.base,
                    (ulong)(uint)pmVar3[race._4_4_].blows[(int)(uint)race].dice.dice,
                    (ulong)(uint)pmVar3[race._4_4_].blows[(int)(uint)race].dice.sides,
                    (ulong)(uint)pmVar3[race._4_4_].blows[(int)(uint)race].dice.m_bonus,
                    in_stack_fffffffffffffe78,uVar6,uVar4);
          file_putf(fff,":%d",(ulong)(uint)pmVar3[race._4_4_].blows[(int)(uint)race].times_seen);
          file_putf(fff,":%d",(ulong)(uint)race);
          file_putf(fff,"\n");
        }
      }
      write_flags(fff,"flags:",pmVar3[race._4_4_].flags,0xc,r_info_flags);
      flag_inter(pmVar3[race._4_4_].spell_flags,pmVar2[race._4_4_].spell_flags,0xd);
      write_flags(fff,"spells:",pmVar3[race._4_4_].spell_flags,0xd,r_info_spell_flags);
      if (pmVar3[race._4_4_].drops != (monster_drop *)0x0) {
        name._112_8_ = pmVar3[race._4_4_].drops;
        memset(&kind,0,0x78);
        while (name._112_8_ != 0) {
          puVar1 = *(undefined8 **)(name._112_8_ + 8);
          if (puVar1 == (undefined8 *)0x0) {
            pcVar5 = tval_find_name(*(wchar_t *)(name._112_8_ + 0x10));
            file_putf(fff,"drop-base:%s:%d:%d:%d\n",pcVar5,(ulong)*(uint *)(name._112_8_ + 0x14),
                      (ulong)*(uint *)(name._112_8_ + 0x18),(ulong)*(uint *)(name._112_8_ + 0x1c));
            name._112_8_ = *(undefined8 *)name._112_8_;
          }
          else {
            object_short_name((char *)&kind,0x78,(char *)*puVar1);
            uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
            pcVar5 = tval_find_name(*(wchar_t *)((long)puVar1 + 0x24));
            in_stack_fffffffffffffe78 =
                 (monster_friends_base *)CONCAT44(uVar7,*(undefined4 *)(name._112_8_ + 0x1c));
            file_putf(fff,"drop:%s:%s:%d:%d:%d\n",pcVar5,&kind,(ulong)*(uint *)(name._112_8_ + 0x14)
                      ,(ulong)*(uint *)(name._112_8_ + 0x18),in_stack_fffffffffffffe78);
            name._112_8_ = *(undefined8 *)name._112_8_;
          }
        }
      }
      if (pmVar3[race._4_4_].friends != (monster_friends *)0x0) {
        for (role_name = (char *)pmVar3[race._4_4_].friends; role_name != (char *)0x0;
            role_name = *(char **)role_name) {
          if (*(int *)(role_name + 0x18) == 3) {
            file_putf(fff,"friends:%d:%dd%d:%s\n",(ulong)*(uint *)(role_name + 0x1c),
                      (ulong)*(uint *)(role_name + 0x20),(ulong)*(uint *)(role_name + 0x24),
                      *(undefined8 *)(*(long *)(role_name + 0x10) + 0x10),in_stack_fffffffffffffe78)
            ;
          }
          else {
            b = (monster_friends_base *)0x0;
            if (*(int *)(role_name + 0x18) == 1) {
              b = (monster_friends_base *)string_make("servant");
            }
            else if (*(int *)(role_name + 0x18) == 2) {
              b = (monster_friends_base *)string_make("bodyguard");
            }
            in_stack_fffffffffffffe78 = b;
            file_putf(fff,"friends:%d:%dd%d:%s:%s\n",(ulong)*(uint *)(role_name + 0x1c),
                      (ulong)*(uint *)(role_name + 0x20),(ulong)*(uint *)(role_name + 0x24),
                      *(undefined8 *)(*(long *)(role_name + 0x10) + 0x10),b);
            string_free((char *)b);
          }
        }
      }
      if (pmVar3[race._4_4_].friends_base != (monster_friends_base *)0x0) {
        for (role_name_1 = (char *)pmVar3[race._4_4_].friends_base; role_name_1 != (char *)0x0;
            role_name_1 = *(char **)role_name_1) {
          if (*(int *)(role_name_1 + 0x10) == 3) {
            file_putf(fff,"friends-base:%d:%dd%d:%s\n",(ulong)*(uint *)(role_name_1 + 0x14),
                      (ulong)*(uint *)(role_name_1 + 0x18),(ulong)*(uint *)(role_name_1 + 0x1c),
                      *(undefined8 *)(*(long *)(role_name_1 + 8) + 8),in_stack_fffffffffffffe78);
          }
          else {
            m = (monster_mimic *)0x0;
            if (*(int *)(role_name_1 + 0x10) == 1) {
              m = (monster_mimic *)string_make("servant");
            }
            else if (*(int *)(role_name_1 + 0x10) == 2) {
              m = (monster_mimic *)string_make("bodyguard");
            }
            in_stack_fffffffffffffe78 = (monster_friends_base *)m;
            file_putf(fff,"friends-base:%d:%dd%d:%s:%s\n",(ulong)*(uint *)(role_name_1 + 0x14),
                      (ulong)*(uint *)(role_name_1 + 0x18),(ulong)*(uint *)(role_name_1 + 0x1c),
                      *(undefined8 *)(*(long *)(role_name_1 + 8) + 8),m);
            string_free((char *)m);
          }
        }
      }
      if (pmVar3[race._4_4_].mimic_kinds != (monster_mimic *)0x0) {
        kind_1 = (object_kind *)pmVar3[race._4_4_].mimic_kinds;
        name_1._112_8_ = kind_1->text;
        memset(local_158,0,0x78);
        for (; kind_1 != (object_kind *)0x0; kind_1 = (object_kind *)kind_1->name) {
          object_short_name(local_158,0x78,*(char **)name_1._112_8_);
          pcVar5 = tval_find_name(*(wchar_t *)(name_1._112_8_ + 0x24));
          file_putf(fff,"mimic:%s:%s\n",pcVar5,local_158);
        }
      }
      file_putf(fff,"\n");
    }
  }
  return;
}

Assistant:

static void write_lore_entries(ang_file *fff)
{
	int i, n;

	for (i = 0; i < z_info->r_max - 1; i++) {
		/* Current entry */
		struct monster_race *race = &r_info[i];
		struct monster_lore *lore = &l_list[i];

		/* Ignore non-existent or unseen monsters */
		if (!race->name) continue;
		if (!lore->sights && !lore->all_known) continue;

		/* Output 'name' */
		file_putf(fff, "name:%s\n", race->name);

		/* Output base if we're remembering everything */
		if (lore->all_known)
			file_putf(fff, "base:%s\n", race->base->name);

		/* Output counts */
		file_putf(fff, "counts:%d:%d:%d:%d:%d:%d:%d\n", lore->sights,
				  lore->deaths, lore->tkills, lore->wake, lore->ignore,
				  lore->cast_innate, lore->cast_spell);

		/* Output blow (up to max blows) */
		for (n = 0; n < z_info->mon_blows_max; n++) {
			/* End of blows */
			if (!lore->blow_known[n] && !lore->all_known) continue;
			if (!lore->blows[n].method) continue;

			/* Output blow method */
			file_putf(fff, "blow:%s", lore->blows[n].method->name);

			/* Output blow effect (may be none) */
			file_putf(fff, ":%s", lore->blows[n].effect->name);

			/* Output blow damage (may be 0) */
			file_putf(fff, ":%d+%dd%dM%d", lore->blows[n].dice.base,
					lore->blows[n].dice.dice,
					lore->blows[n].dice.sides,
					lore->blows[n].dice.m_bonus);

			/* Output number of times that blow has been seen */
			file_putf(fff, ":%d", lore->blows[n].times_seen);

			/* Output blow index */
			file_putf(fff, ":%d", n);

			/* End line */
			file_putf(fff, "\n");
		}

		/* Output flags */
		write_flags(fff, "flags:", lore->flags, RF_SIZE, r_info_flags);

		/* Output spell flags (multiple lines) */
		rsf_inter(lore->spell_flags, race->spell_flags);
		write_flags(fff, "spells:", lore->spell_flags, RSF_SIZE,
					r_info_spell_flags);

		/* Output 'drop' */
		if (lore->drops) {
			struct monster_drop *drop = lore->drops;
			char name[120] = "";

			while (drop) {
				struct object_kind *kind = drop->kind;

				if (kind) {
					object_short_name(name, sizeof name, kind->name);
					file_putf(fff, "drop:%s:%s:%d:%d:%d\n",
							  tval_find_name(kind->tval), name,
							  drop->percent_chance, drop->min, drop->max);
					drop = drop->next;
				} else {
					file_putf(fff, "drop-base:%s:%d:%d:%d\n",
							  tval_find_name(drop->tval), drop->percent_chance,
							  drop->min, drop->max);
					drop = drop->next;
				}
			}
		}

		/* Output 'friends' */
		if (lore->friends) {
			struct monster_friends *f = lore->friends;

			while (f) {
				if (f->role == MON_GROUP_MEMBER) {
					file_putf(fff, "friends:%d:%dd%d:%s\n", f->percent_chance,
							  f->number_dice, f->number_side, f->race->name);
				} else {
					char *role_name = NULL;
					if (f->role == MON_GROUP_SERVANT) {
						role_name = string_make("servant");
					} else if (f->role == MON_GROUP_BODYGUARD) {
						role_name = string_make("bodyguard");
					}
					file_putf(fff, "friends:%d:%dd%d:%s:%s\n",
							  f->percent_chance, f->number_dice,
							  f->number_side, f->race->name, role_name);
					string_free(role_name);
				}
				f = f->next;
			}
		}

		/* Output 'friends-base' */
		if (lore->friends_base) {
			struct monster_friends_base *b = lore->friends_base;

			while (b) {
				if (b->role == MON_GROUP_MEMBER) {
					file_putf(fff, "friends-base:%d:%dd%d:%s\n",
							  b->percent_chance, b->number_dice,
							  b->number_side, b->base->name);
				} else {
					char *role_name = NULL;
					if (b->role == MON_GROUP_SERVANT) {
						role_name = string_make("servant");
					} else if (b->role == MON_GROUP_BODYGUARD) {
						role_name = string_make("bodyguard");
					}
					file_putf(fff, "friends-base:%d:%dd%d:%s:%s\n",
							  b->percent_chance, b->number_dice,
							  b->number_side, b->base->name, role_name);
					string_free(role_name);
				}
				b = b->next;
			}
		}

		/* Output 'mimic' */
		if (lore->mimic_kinds) {
			struct monster_mimic *m = lore->mimic_kinds;
			struct object_kind *kind = m->kind;
			char name[120] = "";

			while (m) {
				object_short_name(name, sizeof name, kind->name);
				file_putf(fff, "mimic:%s:%s\n",
						  tval_find_name(kind->tval), name);
				m = m->next;
			}
		}

		file_putf(fff, "\n");
	}
}